

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammaticalAnalyzer.cpp
# Opt level: O1

void __thiscall
LLGrammaticalAnalyzer::AnalyzeToken
          (LLGrammaticalAnalyzer *this,vector<quadraple,_std::allocator<quadraple>_> *token)

{
  pointer pcVar1;
  pointer ppVar2;
  pointer pbVar3;
  long lVar4;
  bool bVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>_>
  *this_00;
  int iVar6;
  uint uVar7;
  int iVar8;
  _Elt_pointer pbVar9;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_01;
  iterator iVar10;
  mapped_type *pmVar11;
  mapped_type_conflict1 *pmVar12;
  long lVar13;
  ostream *poVar14;
  long *plVar15;
  char *pcVar16;
  ulong uVar17;
  pointer pbVar18;
  ulong uVar19;
  pointer pqVar20;
  long lVar21;
  long lVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tt;
  string tp;
  string stritem;
  quadraple item;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  S;
  char local_151;
  LLGrammaticalAnalyzer *local_150;
  int local_144;
  vector<quadraple,_std::allocator<quadraple>_> *local_140;
  value_type local_138;
  key_type local_118;
  key_type local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined8 local_98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>_>
  *local_90;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_150 = this;
  local_140 = token;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_88,0);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"program","");
  std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,&local_d8
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  pqVar20 = (local_140->super__Vector_base<quadraple,_std::allocator<quadraple>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_140->super__Vector_base<quadraple,_std::allocator<quadraple>_>)._M_impl.
      super__Vector_impl_data._M_finish != pqVar20) {
    local_90 = &local_150->TABLE;
    uVar19 = 0;
    local_144 = 0;
    do {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      pcVar1 = pqVar20[uVar19].tokentype._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar1,pcVar1 + pqVar20[uVar19].tokentype._M_string_length);
      local_b8[0] = local_a8;
      pcVar1 = pqVar20[uVar19].attributevalue._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,pcVar1,pcVar1 + pqVar20[uVar19].attributevalue._M_string_length)
      ;
      local_98._0_4_ = pqVar20[uVar19].linenumber;
      local_98._4_4_ = pqVar20[uVar19].lineposition;
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error",5);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        iVar6 = 2;
        std::ostream::flush();
      }
      else {
        pbVar9 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar9 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        pcVar1 = pbVar9[-1]._M_dataplus._M_p;
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,pcVar1,pcVar1 + pbVar9[-1]._M_string_length);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        iVar6 = std::__cxx11::string::compare((char *)&local_d8);
        if (iVar6 == 0) {
          pcVar16 = "REALNUM";
LAB_0011b929:
          std::__cxx11::string::_M_replace
                    ((ulong)&local_f8,0,(char *)local_f8._M_string_length,(ulong)pcVar16);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&local_d8);
          if (iVar6 == 0) {
            pcVar16 = "INTNUM";
            goto LAB_0011b929;
          }
          iVar6 = std::__cxx11::string::compare((char *)&local_d8);
          if (iVar6 == 0) {
            pcVar16 = "ID";
            goto LAB_0011b929;
          }
          std::__cxx11::string::_M_assign((string *)&local_f8);
        }
        if ((local_f8._M_string_length == local_118._M_string_length) &&
           (((char *)local_f8._M_string_length == (char *)0x0 ||
            (iVar6 = bcmp(local_f8._M_dataplus._M_p,local_118._M_dataplus._M_p,
                          local_f8._M_string_length), iVar6 == 0)))) {
          local_144 = local_144 + 1;
          iVar6 = 3;
        }
        else {
          this_00 = local_90;
          this_01 = &std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>_>
                     ::operator[](local_90,&local_118)->_M_t;
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::find(this_01,&local_f8);
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>_>
                    ::operator[](this_00,&local_118);
          if ((_Rb_tree_header *)iVar10._M_node == &(pmVar11->_M_t)._M_impl.super__Rb_tree_header) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"error",5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_98);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
            plVar15 = (long *)std::ostream::operator<<(poVar14,local_98._4_4_);
            std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
            std::ostream::put((char)plVar15);
            iVar6 = 2;
            std::ostream::flush();
          }
          else {
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>_>
                      ::operator[](this_00,&local_118);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[](pmVar11,&local_f8);
            lVar13 = (long)*pmVar12;
            if (lVar13 == -1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"error",5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_98);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
              plVar15 = (long *)std::ostream::operator<<(poVar14,local_98._4_4_);
              std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
              std::ostream::put((char)plVar15);
              iVar6 = 2;
              std::ostream::flush();
            }
            else {
              ppVar2 = (local_150->VectorP).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,ppVar2[lVar13].first._M_dataplus._M_p,
                                   ppVar2[lVar13].first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"->",2);
              ppVar2 = (local_150->VectorP).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pbVar3 = *(pointer *)
                        ((long)&ppVar2[lVar13].second.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl + 8);
              for (pbVar18 = *(pointer *)
                              &ppVar2[lVar13].second.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl; pbVar18 != pbVar3; pbVar18 = pbVar18 + 1) {
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                pcVar1 = (pbVar18->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_138,pcVar1,pcVar1 + pbVar18->_M_string_length);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_138._M_dataplus._M_p,
                                     local_138._M_string_length);
                local_151 = ' ';
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,&local_151,1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p);
                }
              }
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
              std::ostream::put('H');
              std::ostream::flush();
              ppVar2 = (local_150->VectorP).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar6 = 0;
              uVar7 = (int)((ulong)((long)*(pointer *)
                                           ((long)&ppVar2[lVar13].second.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl + 8) -
                                   *(long *)&ppVar2[lVar13].second.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl) >> 5) - 1;
              if (-1 < (int)uVar7) {
                uVar19 = (ulong)uVar7 << 5 | 8;
                lVar21 = (ulong)uVar7 + 1;
                do {
                  lVar22 = *(long *)&(local_150->VectorP).
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar13].second.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl;
                  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                  lVar4 = *(long *)(lVar22 + -8 + uVar19);
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_138,lVar4,*(long *)(lVar22 + uVar19) + lVar4);
                  iVar8 = std::__cxx11::string::compare((char *)&local_138);
                  if (iVar8 != 0) {
                    std::
                    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_88,&local_138);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p != &local_138.field_2) {
                    operator_delete(local_138._M_dataplus._M_p);
                  }
                  uVar19 = uVar19 - 0x20;
                  lVar22 = lVar21 + -1;
                  bVar5 = 0 < lVar21;
                  lVar21 = lVar22;
                } while (lVar22 != 0 && bVar5);
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((iVar6 != 3) && (iVar6 != 0)) break;
      uVar19 = (ulong)local_144;
      pqVar20 = (local_140->super__Vector_base<quadraple,_std::allocator<quadraple>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar17 = ((long)(local_140->super__Vector_base<quadraple,_std::allocator<quadraple>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pqVar20 >> 3) * -0x71c71c71c71c71c7
      ;
    } while (uVar19 <= uVar17 && uVar17 - uVar19 != 0);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No Grammatical Error.",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  return;
}

Assistant:

void LLGrammaticalAnalyzer::AnalyzeToken(std::vector<quadraple> &token) {
    std::stack<std::string> S;
    S.push("program");
    for (int i = 0; i < token.size();) {
        quadraple item = token[i];
        if (S.empty()) {
            std::cout << "Error" << std::endl;
            break;
        }
        std::string tp = S.top();
        S.pop();
        std::string stritem;
        if (item.tokentype == "real") stritem = "REALNUM";
        else if (item.tokentype == "int") stritem = "INTNUM";
        else if (item.tokentype == "identifier") stritem = "ID";
        else stritem = token[i].attributevalue;
        if (stritem == tp) {
            ++i;
            continue;
        } else {
            if (TABLE[tp].find(stritem) == TABLE[tp].end()) {
                std::cout << "error" << " " << item.linenumber << " " << item.lineposition << std::endl;
                break;
            }
            int pr = TABLE[tp][stritem];
            if (pr == -1) {
                std::cout << "error" << " " << item.linenumber << " " << item.lineposition << std::endl;
                break;
            } else {
                //std::cout << pr <<std::endl;
                std::cout << VectorP[pr].first << "->";
                for (auto tt : VectorP[pr].second) {
                    std::cout << tt << ' ';
                }
                std::cout << std::endl;
                for (int j = VectorP[pr].second.size() - 1; j >= 0; j--) {
                    std::string r = VectorP[pr].second[j];
                    if (r != "#") {
                        S.push(r);
                    }
                }
            }
        }
    }
    if (S.empty()) {
        std::cout << "No Grammatical Error." << std::endl;
    }
}